

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int i2c_zip(int pi,uint handle,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  int sent;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)inLen;
  ext[0].ptr = inBuf;
  sent = pigpio_command_ext(pi,0x5c,handle,0,inLen,1,ext,0);
  if (0 < sent) {
    sent = recvMax(pi,outBuf,outLen,sent);
  }
  _pmu(pi);
  return sent;
}

Assistant:

int i2c_zip(
   int pi,
   unsigned handle,
   char    *inBuf,
   unsigned inLen,
   char    *outBuf,
   unsigned outLen)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=0
   p3=inLen
   ## extension ##
   char inBuf[inLen]
   */

   ext[0].size = inLen;
   ext[0].ptr = inBuf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_I2CZ, handle, 0, inLen, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, outBuf, outLen, bytes);
   }

   _pmu(pi);

   return bytes;
}